

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_open(mtar_t *tar,char *filename,char *mode)

{
  char *pcVar1;
  FILE *fp_00;
  undefined1 local_118 [8];
  mtar_header_t h;
  int err;
  FILE *fp;
  char *mode_local;
  char *filename_local;
  mtar_t *tar_local;
  
  pcVar1 = strchr(mode,0x72);
  fp = (FILE *)mode;
  if (pcVar1 != (char *)0x0) {
    fp = (FILE *)anon_var_dwarf_bb5;
  }
  pcVar1 = strchr((char *)fp,0x77);
  if (pcVar1 != (char *)0x0) {
    fp = (FILE *)anon_var_dwarf_bcb;
  }
  pcVar1 = strchr((char *)fp,0x61);
  if (pcVar1 != (char *)0x0) {
    fp = (FILE *)anon_var_dwarf_bd5;
  }
  fp_00 = fopen(filename,(char *)fp);
  if (fp_00 == (FILE *)0x0) {
    tar_local._4_4_ = -2;
  }
  else {
    h.linkname._96_4_ = mtar_open_fp(tar,fp_00);
    tar_local._4_4_ = h.linkname._96_4_;
    if (h.linkname._96_4_ == 0) {
      if (((char)fp->_flags == 'r') &&
         (h.linkname._96_4_ = mtar_read_header(tar,(mtar_header_t *)local_118),
         h.linkname._96_4_ != 0)) {
        mtar_close(tar);
        tar_local._4_1_ = h.linkname[0x60];
        tar_local._5_1_ = h.linkname[0x61];
        tar_local._6_1_ = h.linkname[0x62];
        tar_local._7_1_ = h.linkname[99];
      }
      else {
        tar_local._4_4_ = 0;
      }
    }
  }
  return tar_local._4_4_;
}

Assistant:

int mtar_open(mtar_t *tar, const char *filename, const char *mode) {
  FILE *fp;
  int err;
  mtar_header_t h;

  /* Assure mode is always binary */
  if ( strchr(mode, 'r') ) mode = "rb";
  if ( strchr(mode, 'w') ) mode = "wb";
  if ( strchr(mode, 'a') ) mode = "ab";

  /* Open file */
  fp = fopen(filename, mode);
  if (!fp) {
    return MTAR_EOPENFAIL;
  }

  err = mtar_open_fp(tar, fp);
  if (err) {
    return err;
  }

  /* Read first header to check it is valid if mode is `r` */
  if (*mode == 'r') {
    err = mtar_read_header(tar, &h);
    if (err != MTAR_ESUCCESS) {
      mtar_close(tar);
      return err;
    }
  }

  /* Return ok */
  return MTAR_ESUCCESS;
}